

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNumGen.cpp
# Opt level: O1

void __thiscall OpenMD::Utils::RandNumGen::RandNumGen(RandNumGen *this,result_type seed)

{
  size_t __i;
  long lVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __begin_00;
  size_t __i_1;
  ulong uVar2;
  value_type_conflict3 *__val;
  seed_seq seq;
  seed_seq local_13c0;
  ulong local_13a8 [624];
  undefined8 local_28;
  
  (this->engine)._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar2 = 0x1571;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar1);
    (this->engine)._M_x[lVar1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x270);
  (this->engine)._M_p = 0x270;
  __begin._M_current = (unsigned_long *)operator_new(8);
  *__begin._M_current = 0;
  __begin_00._M_current = (unsigned_long *)operator_new(8);
  *__begin_00._M_current = seed;
  std::seed_seq::
  seed_seq<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (&local_13c0,__begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(__begin_00._M_current + 1));
  std::seed_seq::
  generate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (&local_13c0,__begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(__begin._M_current + 1));
  local_13a8[0] = (ulong)(uint)*__begin._M_current;
  lVar1 = 1;
  uVar2 = local_13a8[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar1);
    local_13a8[lVar1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x270);
  local_28 = 0x270;
  memcpy(this,local_13a8,5000);
  if (local_13c0._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13c0._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_13c0._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13c0._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(__begin_00._M_current,8);
  operator_delete(__begin._M_current,8);
  return;
}

Assistant:

RandNumGen::RandNumGen(result_type seed) {
    int worldRank {};
    int nProcessors {1};

#ifdef IS_MPI
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &nProcessors);
#endif
    result_type result;
    std::vector<result_type> seeds(nProcessors);

#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      std::vector<result_type> initalSequence(nProcessors);
      std::iota(initalSequence.begin(), initalSequence.end(), seed);

      // Generate the seed_seq to initialize the RNG on each processor
      std::seed_seq seq(initalSequence.begin(), initalSequence.end());

      seq.generate(seeds.begin(), seeds.end());
#ifdef IS_MPI
    }

    MPI_Bcast(&seeds[0], nProcessors, MPI_UINT32_T, 0, MPI_COMM_WORLD);
#endif
    result = seeds[worldRank];

    engine = std::mt19937(result);
  }